

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

void __thiscall
HighsMipSolverData::updatePrimalDualIntegral
          (HighsMipSolverData *this,double from_lower_bound,double to_lower_bound,
          double from_upper_bound,double to_upper_bound,bool check_bound_change,bool check_prev_data
          )

{
  double *pdVar1;
  byte bVar2;
  undefined7 in_register_00000009;
  byte in_DL;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *pvVar3;
  byte in_SIL;
  long *in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double time_diff;
  double time;
  bool gap_consistent;
  double gap_inconsistency;
  bool ub_consistent;
  double ub_inconsistency;
  bool lb_consistent;
  double lb_inconsistency;
  double upper_bound_difference_1;
  double lower_bound_difference_1;
  double upper_bound_difference;
  double lower_bound_difference;
  bool bound_change;
  double bound_change_tolerance;
  double ub_difference;
  double lb_difference;
  double to_gap;
  double to_ub;
  double to_lb;
  double from_gap;
  double from_ub;
  double from_lb;
  HighsPrimaDualIntegral *pdi;
  double *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  double in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  HighsMipSolverData *in_stack_ffffffffffffff40;
  long local_60;
  long local_58;
  
  pdVar1 = (double *)(in_RDI + 0xd11);
  bVar2 = in_SIL & 1;
  dVar4 = limitsToGap(in_stack_ffffffffffffff40,
                      (double)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                      in_stack_ffffffffffffff30,
                      (double *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                      in_stack_ffffffffffffff20);
  dVar5 = limitsToGap(in_stack_ffffffffffffff40,
                      (double)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                      in_stack_ffffffffffffff30,
                      (double *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                      in_stack_ffffffffffffff20);
  dVar6 = possInfRelDiff(in_stack_ffffffffffffff30,
                         (double)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                         (double)in_stack_ffffffffffffff20);
  dVar7 = possInfRelDiff(in_stack_ffffffffffffff30,
                         (double)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                         (double)in_stack_ffffffffffffff20);
  pvVar3 = extraout_RDX;
  if ((in_SIL & 1) == 0) {
    if ((0.0 < dVar6 || 0.0 < dVar7) &&
       ((((in_XMM0_Qa != in_XMM1_Qa || (NAN(in_XMM0_Qa) || NAN(in_XMM1_Qa))) ||
         (in_XMM2_Qa != in_XMM3_Qa)) || (NAN(in_XMM2_Qa) || NAN(in_XMM3_Qa))))) {
      possInfRelDiff(in_stack_ffffffffffffff30,
                     (double)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                     (double)in_stack_ffffffffffffff20);
      possInfRelDiff(in_stack_ffffffffffffff30,
                     (double)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                     (double)in_stack_ffffffffffffff20);
      pvVar3 = extraout_RDX_01;
    }
  }
  else if (0.0 >= dVar6 && 0.0 >= dVar7) {
    if ((in_XMM0_Qa == in_XMM1_Qa) && (!NAN(in_XMM0_Qa) && !NAN(in_XMM1_Qa))) {
      if ((in_XMM2_Qa == in_XMM3_Qa) && (!NAN(in_XMM2_Qa) && !NAN(in_XMM3_Qa))) {
        possInfRelDiff(in_stack_ffffffffffffff30,
                       (double)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                       (double)in_stack_ffffffffffffff20);
        possInfRelDiff(in_stack_ffffffffffffff30,
                       (double)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                       (double)in_stack_ffffffffffffff20);
        pvVar3 = extraout_RDX_00;
      }
    }
  }
  if (*pdVar1 <= -INFINITY) {
    *pdVar1 = 0.0;
  }
  else {
    if ((in_DL & 1) != 0) {
      possInfRelDiff(in_stack_ffffffffffffff30,
                     (double)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                     (double)in_stack_ffffffffffffff20);
      possInfRelDiff(in_stack_ffffffffffffff30,
                     (double)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                     (double)in_stack_ffffffffffffff20);
      possInfRelDiff(in_stack_ffffffffffffff30,
                     (double)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                     (double)in_stack_ffffffffffffff20);
      pvVar3 = extraout_RDX_02;
    }
    if (dVar5 < INFINITY) {
      HighsTimer::read((HighsTimer *)(*in_RDI + 0x168),0,pvVar3,CONCAT71(in_register_00000009,bVar2)
                      );
      if (dVar4 < INFINITY) {
        *pdVar1 = (extraout_XMM0_Qa - (double)in_RDI[0xd15]) * (double)in_RDI[0xd14] + *pdVar1;
      }
      in_RDI[0xd15] = (long)extraout_XMM0_Qa;
    }
  }
  in_RDI[0xd12] = local_58;
  in_RDI[0xd13] = local_60;
  in_RDI[0xd14] = (long)dVar5;
  return;
}

Assistant:

void HighsMipSolverData::updatePrimalDualIntegral(const double from_lower_bound,
                                                  const double to_lower_bound,
                                                  const double from_upper_bound,
                                                  const double to_upper_bound,
                                                  const bool check_bound_change,
                                                  const bool check_prev_data) {
  // Parameters to updatePrimalDualIntegral are lower and upper bounds
  // before/after a change
  //
  // updatePrimalDualIntegral should only be called when there is a
  // change in one of the bounds, except when the final update is
  // made, in which case the bounds must NOT have changed. By default,
  // a check for some bound change is made, unless check_bound_change
  // is false, in which case there is a check for unchanged bounds.
  //
  HighsPrimaDualIntegral& pdi = this->primal_dual_integral;
  // HighsPrimaDualIntegral struct contains the following data
  //
  // * value: Current value of the P-D integral
  //
  // * prev_lb: Value of lb that was computed from to_lower_bound in
  //   the previous call. Used as a check that the value of lb
  //   computed from from_lower_bound in this call is equal - to
  //   within bound_change_tolerance. If not true, then a change in lb
  //   has been missed. Only for checking/debugging
  //
  // * prev_ub: Ditto for upper_bound. Only for checking/debugging
  //
  // * prev_gap: Ditto for gap. Only for checking/debugging
  //
  // * prev_time: Used to determine the time spent at the previous gap

  double from_lb;
  double from_ub;
  const double from_gap =
      this->limitsToGap(from_lower_bound, from_upper_bound, from_lb, from_ub);
  double to_lb;
  double to_ub;
  const double to_gap =
      this->limitsToGap(to_lower_bound, to_upper_bound, to_lb, to_ub);

  const double lb_difference = possInfRelDiff(from_lb, to_lb, to_lb);
  const double ub_difference = possInfRelDiff(from_ub, to_ub, to_ub);
  const double bound_change_tolerance = 0;
  const bool bound_change = lb_difference > bound_change_tolerance ||
                            ub_difference > bound_change_tolerance;

  if (check_bound_change) {
    if (!bound_change) {
      if (from_lower_bound == to_lower_bound &&
          from_upper_bound == to_upper_bound) {
        const double lower_bound_difference =
            possInfRelDiff(from_lower_bound, to_lower_bound, to_lower_bound);
        const double upper_bound_difference =
            possInfRelDiff(from_upper_bound, to_upper_bound, to_upper_bound);
        assert(bound_change);
      }
    }
  } else {
    if (bound_change) {
      if (from_lower_bound != to_lower_bound ||
          from_upper_bound != to_upper_bound) {
        const double lower_bound_difference =
            possInfRelDiff(from_lower_bound, to_lower_bound, to_lower_bound);
        const double upper_bound_difference =
            possInfRelDiff(from_upper_bound, to_upper_bound, to_upper_bound);
        assert(!bound_change);
      }
    }
  }
  if (pdi.value > -kHighsInf) {
    // updatePrimalDualIntegral has been called previously, so can
    // usually test housekeeping, even if gap is still inf
    //
    // The one case where the checking can't be done comes after restart, where
    // the
    //
    if (check_prev_data) {
      // These housekeeping tests check that the previous saved
      // lower/upper bounds and gap are very close to the "from"
      // lower/upper bounds and corresponding gap. They are usually
      // identical, but rounding error can occur when passing through
      // reset, when the old/new offsets are added/subtracted from the
      // bounds due to changes in offset during presolve.
      const double lb_inconsistency =
          possInfRelDiff(from_lb, pdi.prev_lb, pdi.prev_lb);
      const bool lb_consistent = lb_inconsistency < 1e-12;
      const double ub_inconsistency =
          possInfRelDiff(from_ub, pdi.prev_ub, pdi.prev_ub);
      const bool ub_consistent = ub_inconsistency < 1e-12;
      const double gap_inconsistency =
          possInfRelDiff(from_gap, pdi.prev_gap, 1.0);
      const bool gap_consistent = gap_inconsistency < 1e-12;
      assert(lb_consistent);
      assert(ub_consistent);
      assert(gap_consistent);
    }
    if (to_gap < kHighsInf) {
      double time = mipsolver.timer_.read();
      if (from_gap < kHighsInf) {
        // Need to update the P-D integral
        double time_diff = time - pdi.prev_time;
        assert(time_diff >= 0);
        pdi.value += time_diff * pdi.prev_gap;
      }
      pdi.prev_time = time;
    }
  } else {
    pdi.value = 0;
  }
  pdi.prev_lb = to_lb;
  pdi.prev_ub = to_ub;
  pdi.prev_gap = to_gap;
}